

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_sub.cpp
# Opt level: O0

void duckdb::DateSubBinaryExecutor<duckdb::timestamp_t,duckdb::timestamp_t,long>
               (DatePartSpecifier type,Vector *left,Vector *right,Vector *result,idx_t count)

{
  Vector *right_00;
  NotImplementedException *this;
  byte in_DIL;
  idx_t in_stack_ffffffffffffff88;
  Vector *in_stack_ffffffffffffff90;
  allocator *paVar1;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  allocator local_49;
  string local_48 [72];
  
  right_00 = (Vector *)(ulong)in_DIL;
  switch(right_00) {
  case (Vector *)0x0:
  case (Vector *)0xe:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::YearOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (Vector *)0x1:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::MonthOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (Vector *)0x2:
  case (Vector *)0xb:
  case (Vector *)0xc:
  case (Vector *)0x10:
  case (Vector *)0x17:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::DayOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (Vector *)0x3:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::DecadeOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (Vector *)0x4:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::CenturyOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (Vector *)0x5:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::MilleniumOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (Vector *)0x6:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::MicrosecondsOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (Vector *)0x7:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::MillisecondsOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (Vector *)0x8:
  case (Vector *)0x16:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::SecondsOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (Vector *)0x9:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::MinutesOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (Vector *)0xa:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::HoursOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (Vector *)0xd:
  case (Vector *)0x11:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::WeekOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  case (Vector *)0xf:
    DateSub::
    BinaryExecute<duckdb::timestamp_t,duckdb::timestamp_t,long,duckdb::DateSub::QuarterOperator>
              ((Vector *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),right_00,
               in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    break;
  default:
    this = (NotImplementedException *)__cxa_allocate_exception(0x10);
    paVar1 = &local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"Specifier type not implemented for DATESUB",paVar1);
    duckdb::NotImplementedException::NotImplementedException(this,local_48);
    __cxa_throw(this,&NotImplementedException::typeinfo,
                NotImplementedException::~NotImplementedException);
  }
  return;
}

Assistant:

static void DateSubBinaryExecutor(DatePartSpecifier type, Vector &left, Vector &right, Vector &result, idx_t count) {
	switch (type) {
	case DatePartSpecifier::YEAR:
	case DatePartSpecifier::ISOYEAR:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::YearOperator>(left, right, result, count);
		break;
	case DatePartSpecifier::MONTH:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::MonthOperator>(left, right, result, count);
		break;
	case DatePartSpecifier::DAY:
	case DatePartSpecifier::DOW:
	case DatePartSpecifier::ISODOW:
	case DatePartSpecifier::DOY:
	case DatePartSpecifier::JULIAN_DAY:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::DayOperator>(left, right, result, count);
		break;
	case DatePartSpecifier::DECADE:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::DecadeOperator>(left, right, result, count);
		break;
	case DatePartSpecifier::CENTURY:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::CenturyOperator>(left, right, result, count);
		break;
	case DatePartSpecifier::MILLENNIUM:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::MilleniumOperator>(left, right, result, count);
		break;
	case DatePartSpecifier::QUARTER:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::QuarterOperator>(left, right, result, count);
		break;
	case DatePartSpecifier::WEEK:
	case DatePartSpecifier::YEARWEEK:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::WeekOperator>(left, right, result, count);
		break;
	case DatePartSpecifier::MICROSECONDS:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::MicrosecondsOperator>(left, right, result, count);
		break;
	case DatePartSpecifier::MILLISECONDS:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::MillisecondsOperator>(left, right, result, count);
		break;
	case DatePartSpecifier::SECOND:
	case DatePartSpecifier::EPOCH:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::SecondsOperator>(left, right, result, count);
		break;
	case DatePartSpecifier::MINUTE:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::MinutesOperator>(left, right, result, count);
		break;
	case DatePartSpecifier::HOUR:
		DateSub::BinaryExecute<TA, TB, TR, DateSub::HoursOperator>(left, right, result, count);
		break;
	default:
		throw NotImplementedException("Specifier type not implemented for DATESUB");
	}
}